

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O0

uint32_t __thiscall cppnet::BufferQueue::Write(BufferQueue *this,char *str,uint32_t len)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined1 local_48 [32];
  uint local_28;
  uint32_t local_24;
  uint32_t write_len;
  uint32_t len_local;
  char *str_local;
  BufferQueue *this_local;
  
  if ((str == (char *)0x0) || (len == 0)) {
    this_local._4_4_ = 0;
  }
  else {
    local_28 = 0;
    local_24 = len;
    _write_len = str;
    str_local = (char *)this;
    while( true ) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->_buffer_write);
      if (!bVar1) {
        (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[0x13])();
        List<cppnet::BufferBlock>::GetTail((List<cppnet::BufferBlock> *)(local_48 + 0x10));
        std::shared_ptr<cppnet::BufferBlock>::operator=
                  (&this->_buffer_write,(shared_ptr<cppnet::BufferBlock> *)(local_48 + 0x10));
        std::shared_ptr<cppnet::BufferBlock>::~shared_ptr
                  ((shared_ptr<cppnet::BufferBlock> *)(local_48 + 0x10));
      }
      peVar3 = std::
               __shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->_buffer_write);
      iVar2 = (*(peVar3->super_InnerBuffer).super_Buffer._vptr_Buffer[10])
                        (peVar3,_write_len + local_28,(ulong)(local_24 - local_28));
      local_28 = iVar2 + local_28;
      if (local_24 <= local_28) break;
      std::__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&this->_buffer_write);
      ListSlot<cppnet::BufferBlock>::GetNext((ListSlot<cppnet::BufferBlock> *)local_48);
      std::shared_ptr<cppnet::BufferBlock>::operator=
                (&this->_buffer_write,(shared_ptr<cppnet::BufferBlock> *)local_48);
      std::shared_ptr<cppnet::BufferBlock>::~shared_ptr((shared_ptr<cppnet::BufferBlock> *)local_48)
      ;
    }
    this->_can_read_length = local_28 + this->_can_read_length;
    this_local._4_4_ = local_28;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t BufferQueue::Write(const char* str, uint32_t len) {
    if (!str || len == 0) {
        return 0;
    }
    
    uint32_t write_len = 0;

    while (1) {
        if (!_buffer_write) {
            Append();
            _buffer_write = _buffer_list.GetTail();
        }

        write_len += _buffer_write->Write(str + write_len, len - write_len);

        if (write_len >= len) {
            break;
        }
        _buffer_write = _buffer_write->GetNext();
    }
    _can_read_length += write_len;
    return write_len;
}